

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O3

void cvErrHandler(int error_code,char *module,char *function,char *msg,void *data)

{
  char err_type [10];
  undefined8 local_20 [2];
  
  if (error_code == 99) {
    local_20[0] = 0x474e494e524157;
  }
  else {
    local_20[0] = CONCAT26(local_20[0]._6_2_,0x5200000000);
    local_20[0] = CONCAT44(local_20[0]._4_4_,0x4f525245);
  }
  if (*(FILE **)((long)data + 0x480) != (FILE *)0x0) {
    fprintf(*(FILE **)((long)data + 0x480),"\n[%s %s]  %s\n",module,local_20,function);
    fprintf(*(FILE **)((long)data + 0x480),"  %s\n\n",msg);
  }
  return;
}

Assistant:

void cvErrHandler(int error_code, const char *module,
                  const char *function, char *msg, void *data)
{
  CVodeMem cv_mem;
  char err_type[10];

  /* data points to cv_mem here */

  cv_mem = (CVodeMem) data;

  if (error_code == CV_WARNING)
    sprintf(err_type,"WARNING");
  else
    sprintf(err_type,"ERROR");

#ifndef NO_FPRINTF_OUTPUT
  if (cv_mem->cv_errfp!=NULL) {
    fprintf(cv_mem->cv_errfp,"\n[%s %s]  %s\n",module,err_type,function);
    fprintf(cv_mem->cv_errfp,"  %s\n\n",msg);
  }
#endif

  return;
}